

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

TransactionController * __thiscall
cfd::TransactionController::AddTxIn
          (TransactionController *this,Txid *txid,uint32_t vout,Pubkey *pubkey,uint32_t sequence)

{
  uint in_R9D;
  Pubkey local_88;
  undefined8 local_70;
  Script local_68;
  
  local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002b0fc0;
  local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = 0;
  cfd::core::ScriptBuilder::AppendData(&local_88);
  cfd::core::ScriptBuilder::Build();
  cfd::core::Transaction::AddTxIn
            ((Txid *)&(txid->data_).data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish,vout,(uint)pubkey,(Script *)(ulong)in_R9D);
  core::Script::~Script(&local_68);
  local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002b0fc0;
  if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_88.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  cfd::core::Transaction::GetTxIn((uint)this);
  return this;
}

Assistant:

const TxInReference TransactionController::AddTxIn(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey, uint32_t sequence) {
  uint32_t index = transaction_.AddTxIn(
      txid, vout, sequence, ScriptBuilder().AppendData(pubkey).Build());
  return transaction_.GetTxIn(index);
}